

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O2

CharType onmt::unicode::get_char_type(int8_t category)

{
  if ((byte)(category - 1U) < 0xe) {
    return *(CharType *)(&DAT_0027af0c + (ulong)(byte)(category - 1U) * 4);
  }
  return Other;
}

Assistant:

static inline CharType get_char_type(const int8_t category)
    {
      switch (category)
      {
      case U_SPACE_SEPARATOR:
      case U_LINE_SEPARATOR:
      case U_PARAGRAPH_SEPARATOR:
        return CharType::Separator;

      case U_DECIMAL_DIGIT_NUMBER:
      case U_LETTER_NUMBER:
      case U_OTHER_NUMBER:
        return CharType::Number;

      case U_UPPERCASE_LETTER:
      case U_LOWERCASE_LETTER:
      case U_TITLECASE_LETTER:
      case U_MODIFIER_LETTER:
      case U_OTHER_LETTER:
        return CharType::Letter;

      case U_NON_SPACING_MARK:
      case U_ENCLOSING_MARK:
      case U_COMBINING_SPACING_MARK:
        return CharType::Mark;

      default:
        return CharType::Other;
      }
    }